

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<float>::SwapElements
          (RepeatedField<float> *this,int index1,int index2)

{
  bool is_soo;
  float *pfVar1;
  float *elem;
  int index2_local;
  int index1_local;
  RepeatedField<float> *this_local;
  
  is_soo = RepeatedField<float>::is_soo(this);
  pfVar1 = elements(this,is_soo);
  std::swap<float>(pfVar1 + index1,pfVar1 + index2);
  return;
}

Assistant:

void RepeatedField<Element>::SwapElements(int index1, int index2) {
  Element* elem = elements(is_soo());
  using std::swap;  // enable ADL with fallback
  swap(elem[index1], elem[index2]);
}